

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O3

void Cba_NtkObjOrder(Cba_Ntk_t *p,Vec_Int_t *vObjs,Vec_Int_t *vNameIds)

{
  uint uVar1;
  void *__ptr;
  int iVar2;
  uint *__ptr_00;
  void *pvVar3;
  Cba_Man_t *pCVar4;
  char *pcVar5;
  size_t sVar6;
  char *pcVar7;
  int *piVar8;
  long lVar9;
  long lVar10;
  size_t sVar11;
  char Buffer [1000];
  ulong local_430;
  char local_418 [1000];
  
  uVar1 = vObjs->nSize;
  if ((int)uVar1 < 2) {
    return;
  }
  __ptr_00 = (uint *)malloc(0x10);
  local_430 = 8;
  if (8 < uVar1) {
    local_430 = (ulong)uVar1;
  }
  __ptr_00[1] = 0;
  *__ptr_00 = (uint)local_430;
  pvVar3 = malloc(local_430 * 8);
  *(void **)(__ptr_00 + 2) = pvVar3;
  lVar10 = 0;
  sVar6 = 0;
  do {
    sVar11 = sVar6;
    uVar1 = vObjs->pArray[sVar11];
    lVar9 = (long)(int)uVar1;
    if (lVar9 < 1) {
      __assert_fail("i>0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cba.h"
                    ,0xd5,"Cba_ObjType_t Cba_ObjType(Cba_Ntk_t *, int)");
    }
    if ((p->vObjType).nSize <= (int)uVar1) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                    ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
    }
    pCVar4 = p->pDesign;
    pcVar7 = pCVar4->pTypeNames[(byte)(p->vObjType).pArray[lVar9]];
    if (vNameIds == (Vec_Int_t *)0x0) {
      if ((p->vObjName).nSize < 1) {
        __assert_fail("Cba_NtkHasObjNames(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cba.h"
                      ,0xf0,"int Cba_ObjName(Cba_Ntk_t *, int)");
      }
      Vec_IntFillExtra(&p->vObjName,uVar1 + 1,0);
      if ((p->vObjName).nSize <= (int)uVar1) goto LAB_003ab74f;
      piVar8 = (p->vObjName).pArray + lVar9;
      pCVar4 = p->pDesign;
    }
    else {
      if ((long)vNameIds->nSize <= (long)sVar11) {
LAB_003ab74f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar8 = (int *)((long)vNameIds->pArray + lVar10);
    }
    pcVar5 = Abc_NamStr(pCVar4->pStrs,*piVar8);
    sprintf(local_418,"%s_%s_%d",pcVar7,pcVar5,(ulong)uVar1);
    sVar6 = strlen(local_418);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,local_418);
    iVar2 = (int)local_430;
    if ((int)sVar11 == iVar2) {
      if (iVar2 < 0x10) {
        if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
          pvVar3 = malloc(0x80);
        }
        else {
          pvVar3 = realloc(*(void **)(__ptr_00 + 2),0x80);
        }
        *(void **)(__ptr_00 + 2) = pvVar3;
        *__ptr_00 = 0x10;
        local_430 = 0x10;
      }
      else {
        local_430 = (ulong)(uint)(iVar2 * 2);
        if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
          pvVar3 = malloc(local_430 * 8);
        }
        else {
          pvVar3 = realloc(*(void **)(__ptr_00 + 2),local_430 * 8);
        }
        *(void **)(__ptr_00 + 2) = pvVar3;
        *__ptr_00 = iVar2 * 2;
      }
    }
    else {
      pvVar3 = *(void **)(__ptr_00 + 2);
    }
    *(char **)((long)pvVar3 + sVar11 * 8) = pcVar7;
    sVar6 = sVar11 + 1;
    lVar10 = lVar10 + 4;
    if ((long)vObjs->nSize <= (long)sVar6) {
      pvVar3 = *(void **)(__ptr_00 + 2);
      if ((int)sVar6 != 1) {
        qsort(pvVar3,sVar6,8,Cba_StrCmp);
      }
      vObjs->nSize = 0;
      sVar6 = 0xffffffffffffffff;
      do {
        pcVar7 = strrchr(*(char **)((long)pvVar3 + sVar6 * 8 + 8),0x5f);
        iVar2 = atoi(pcVar7 + 1);
        Vec_IntPush(vObjs,iVar2);
        sVar6 = sVar6 + 1;
      } while (sVar11 != sVar6);
      sVar6 = 0xffffffffffffffff;
      do {
        __ptr = *(void **)((long)pvVar3 + sVar6 * 8 + 8);
        if ((void *)0x2 < __ptr) {
          free(__ptr);
        }
        sVar6 = sVar6 + 1;
      } while (sVar11 != sVar6);
      free(pvVar3);
      free(__ptr_00);
      return;
    }
  } while( true );
}

Assistant:

void Cba_NtkObjOrder( Cba_Ntk_t * p, Vec_Int_t * vObjs, Vec_Int_t * vNameIds )
{
    char Buffer[1000], * pName;
    Vec_Ptr_t * vNames;
    int i, iObj;
    if ( Vec_IntSize(vObjs) < 2 )
        return;
    vNames = Vec_PtrAlloc( Vec_IntSize(vObjs) );
    Vec_IntForEachEntry( vObjs, iObj, i )
    {
        char * pTypeName = Cba_NtkTypeName( p, Cba_ObjType(p, iObj) );
        char * pInstName = vNameIds ? Cba_NtkStr(p, Vec_IntEntry(vNameIds, i)) : Cba_ObjNameStr(p, iObj);
        sprintf( Buffer, "%s_%s_%d", pTypeName, pInstName, iObj );
        Vec_PtrPush( vNames, Abc_UtilStrsav(Buffer) );
    }
    // print before
//    Vec_PtrForEachEntry( char *, vNames, pName, i )
//        printf( "%s \n", pName );
//    printf( "\n" );
    // do the sorting
    Vec_PtrSort( vNames, (int (*)(void))Cba_StrCmp );
    // print after
//    Vec_PtrForEachEntry( char *, vNames, pName, i )
//        printf( "%s \n", pName );
//    printf( "\n" );
    // reload in a new order
    Vec_IntClear( vObjs );
    Vec_PtrForEachEntry( char *, vNames, pName, i )
        Vec_IntPush( vObjs, atoi(strrchr(pName, '_')+1) );
    Vec_PtrFreeFree( vNames );
}